

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

char * basist::basis_get_block_format_name(block_format fmt)

{
  undefined4 in_EDI;
  char *local_8;
  
  switch(in_EDI) {
  case 0:
    local_8 = "ETC1";
    break;
  case 1:
    local_8 = "ETC2_RGBA";
    break;
  case 2:
    local_8 = "BC1";
    break;
  case 3:
    local_8 = "BC3";
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x2a8b,"const char *basist::basis_get_block_format_name(block_format)");
  case 6:
    local_8 = "PVRTC1_4_RGB";
    break;
  case 7:
    local_8 = "PVRTC1_4_RGBA";
    break;
  case 8:
    local_8 = "BC7";
    break;
  case 0xc:
    local_8 = "ASTC_4x4";
    break;
  case 0xd:
    local_8 = "ATC_RGB";
    break;
  case 0xf:
    local_8 = "FXT1_RGB";
    break;
  case 0x10:
    local_8 = "PVRTC2_4_RGB";
    break;
  case 0x11:
    local_8 = "PVRTC2_4_RGBA";
    break;
  case 0x12:
    local_8 = "ETC2_EAC_R11";
    break;
  case 0x13:
    local_8 = "ETC2_EAC_RG11";
    break;
  case 0x16:
    local_8 = "RGBA32";
    break;
  case 0x18:
    local_8 = "RGB565";
    break;
  case 0x19:
    local_8 = "BGR565";
    break;
  case 0x1d:
    local_8 = "RGBA4444";
    break;
  case 0x1e:
    local_8 = "UASTC_4x4";
  }
  return local_8;
}

Assistant:

const char* basis_get_block_format_name(block_format fmt)
	{
		switch (fmt)
		{
		case block_format::cETC1: return "ETC1";
		case block_format::cBC1: return "BC1";
		case block_format::cPVRTC1_4_RGB: return "PVRTC1_4_RGB";
		case block_format::cPVRTC1_4_RGBA: return "PVRTC1_4_RGBA";
		case block_format::cBC7: return "BC7";
		case block_format::cETC2_RGBA: return "ETC2_RGBA";
		case block_format::cBC3: return "BC3";
		case block_format::cASTC_4x4: return "ASTC_4x4";
		case block_format::cATC_RGB: return "ATC_RGB";
		case block_format::cRGBA32: return "RGBA32";
		case block_format::cRGB565: return "RGB565";
		case block_format::cBGR565: return "BGR565";
		case block_format::cRGBA4444: return "RGBA4444";
		case block_format::cUASTC_4x4: return "UASTC_4x4";
		case block_format::cFXT1_RGB: return "FXT1_RGB";
		case block_format::cPVRTC2_4_RGB: return "PVRTC2_4_RGB";
		case block_format::cPVRTC2_4_RGBA: return "PVRTC2_4_RGBA";
		case block_format::cETC2_EAC_R11: return "ETC2_EAC_R11";
		case block_format::cETC2_EAC_RG11: return "ETC2_EAC_RG11";
		default:
			assert(0);
			BASISU_DEVEL_ERROR("basis_get_basisu_texture_format: Invalid fmt\n");
		break;
		}
		return "";
	}